

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrsBuild.c
# Opt level: O2

int Psr_ManIsMapped(Psr_Ntk_t *pNtk)

{
  int iVar1;
  Mio_Library_t *pLib;
  char *pName;
  Mio_Gate_t *pMVar2;
  int i;
  
  pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
  if (pLib != (Mio_Library_t *)0x0) {
    for (i = 0; i < (pNtk->vObjs).nSize; i = i + 1) {
      Psr_BoxSignals(pNtk,i);
      iVar1 = Psr_BoxIsNode(pNtk,i);
      if (iVar1 == 0) {
        iVar1 = Psr_BoxNtk(pNtk,i);
        pName = Psr_NtkStr(pNtk,iVar1);
        pMVar2 = Mio_LibraryReadGateByName(pLib,pName,(char *)0x0);
        if (pMVar2 != (Mio_Gate_t *)0x0) {
          return 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Psr_ManIsMapped( Psr_Ntk_t * pNtk )
{
    Vec_Int_t * vSigs; int iBox;
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    if ( pLib == NULL )
        return 0;
    Psr_NtkForEachBox( pNtk, vSigs, iBox )
        if ( !Psr_BoxIsNode(pNtk, iBox) )
        {
            int NtkId = Psr_BoxNtk( pNtk, iBox );
            if ( Mio_LibraryReadGateByName(pLib, Psr_NtkStr(pNtk, NtkId), NULL) )
                return 1;
        }
    return 0;
}